

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymbolAccess.cpp
# Opt level: O0

int __thiscall bhf::ads::SymbolAccess::Write(SymbolAccess *this,string *name,string *value)

{
  bool bVar1;
  pointer ppVar2;
  ostream *poVar3;
  string local_450 [32];
  stringstream local_430 [8];
  stringstream stream_1;
  ostream local_420 [376];
  undefined1 local_2a8 [8];
  SymbolEntry entry;
  string local_220 [32];
  stringstream local_200 [8];
  stringstream stream;
  ostream local_1f0 [376];
  _Self local_78 [3];
  _Self local_60;
  const_iterator it;
  SymbolEntryMap entries;
  string *value_local;
  string *name_local;
  SymbolAccess *this_local;
  
  FetchSymbolEntries_abi_cxx11_((SymbolEntryMap *)&it,this);
  local_60._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bhf::ads::SymbolEntry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bhf::ads::SymbolEntry>_>_>
       ::find((SymbolEntryMap *)&it,name);
  local_78[0]._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bhf::ads::SymbolEntry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bhf::ads::SymbolEntry>_>_>
       ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bhf::ads::SymbolEntry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bhf::ads::SymbolEntry>_>_>
              *)&it);
  bVar1 = std::operator==(&local_60,local_78);
  if (bVar1) {
    std::__cxx11::stringstream::stringstream(local_200);
    poVar3 = std::operator<<(local_1f0,"Write");
    poVar3 = std::operator<<(poVar3,"(): symbol \'");
    poVar3 = std::operator<<(poVar3,(string *)name);
    std::operator<<(poVar3,"\' not found\n");
    std::__cxx11::stringstream::str();
    Logger::Log(2,local_220);
    std::__cxx11::string::~string((string *)local_220);
    std::__cxx11::stringstream::~stringstream(local_200);
    this_local._4_4_ = 0x710;
    entry._124_4_ = 1;
  }
  else {
    ppVar2 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bhf::ads::SymbolEntry>_>
             ::operator->(&local_60);
    SymbolEntry::SymbolEntry((SymbolEntry *)local_2a8,&ppVar2->second);
    switch(entry.header.iOffs) {
    case 2:
      this_local._4_4_ = Write<short>(this,(SymbolEntry *)local_2a8,value);
      break;
    case 3:
      this_local._4_4_ = Write<int>(this,(SymbolEntry *)local_2a8,value);
      break;
    case 4:
      this_local._4_4_ = Write<float>(this,(SymbolEntry *)local_2a8,value);
      break;
    case 5:
      this_local._4_4_ = Write<double>(this,(SymbolEntry *)local_2a8,value);
      break;
    default:
      std::__cxx11::stringstream::stringstream(local_430);
      poVar3 = std::operator<<(local_420,"Write");
      poVar3 = std::operator<<(poVar3,"() Unknown type \'");
      poVar3 = std::operator<<(poVar3,(string *)&entry.field_0x38);
      std::operator<<(poVar3,"\' writting as string\n");
      std::__cxx11::stringstream::str();
      Logger::Log(2,local_450);
      std::__cxx11::string::~string((string *)local_450);
      std::__cxx11::stringstream::~stringstream(local_430);
      this_local._4_4_ = Write<std::__cxx11::string>(this,(SymbolEntry *)local_2a8,value);
      break;
    case 0x11:
    case 0x21:
      this_local._4_4_ = Write<unsigned_char>(this,(SymbolEntry *)local_2a8,value);
      break;
    case 0x12:
      this_local._4_4_ = Write<unsigned_short>(this,(SymbolEntry *)local_2a8,value);
      break;
    case 0x13:
      this_local._4_4_ = Write<unsigned_int>(this,(SymbolEntry *)local_2a8,value);
      break;
    case 0x15:
      this_local._4_4_ = Write<unsigned_long>(this,(SymbolEntry *)local_2a8,value);
    }
    entry._124_4_ = 1;
    SymbolEntry::~SymbolEntry((SymbolEntry *)local_2a8);
  }
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bhf::ads::SymbolEntry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bhf::ads::SymbolEntry>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bhf::ads::SymbolEntry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bhf::ads::SymbolEntry>_>_>
          *)&it);
  return this_local._4_4_;
}

Assistant:

int SymbolAccess::Write(const std::string& name, const std::string& value) const
{
    const auto entries = FetchSymbolEntries();
    const auto it = entries.find(name);
    if (it == entries.end()) {
        LOG_WARN(__FUNCTION__ << "(): symbol '" << name << "' not found\n");
        return ADSERR_DEVICE_SYMBOLNOTFOUND;
    }

    const auto entry = it->second;

    switch (entry.header.dataType) {
    case 0x2:     //INT
        return Write<int16_t>(entry, value);

    case 0x3:     //DINT
        return Write<int32_t>(entry, value);

    case 0x4:     //REAL
        return Write<float>(entry, value);

    case 0x5:     //LREAL
        return Write<double>(entry, value);

    case 0x11:     // BYTE
    case 0x21:     // BOOL
        return Write<uint8_t>(entry, value);

    case 0x12:     // WORD, UINT
        return Write<uint16_t>(entry, value);

    case 0x13:     // DWORD, UDINT
        return Write<uint32_t>(entry, value);

    case 0x15:     // LWORD, ULINT
        return Write<uint64_t>(entry, value);

    default:
        LOG_WARN(__FUNCTION__ << "() Unknown type '" << entry.typeName << "' writting as string\n");
        return Write<std::string>(entry, value);
    }
}